

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O1

void basisu::add_image(imagef *src1,imagef *src2,imagef *dst)

{
  vec<4U,_float> *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  vec<4U,_float> *pvVar11;
  uint uVar12;
  vec<4U,_float> *pvVar13;
  uint uVar14;
  vec4F local_28;
  
  local_28.m_v[0] = 0.0;
  local_28.m_v[1] = 0.0;
  local_28.m_v[2] = 0.0;
  local_28.m_v[3] = 1.0;
  imagef::crop(dst,src1->m_width,src1->m_height,0xffffffff,&local_28);
  if (0 < (int)dst->m_height) {
    uVar8 = 0;
    do {
      if (dst->m_width != 0) {
        uVar9 = 0;
        do {
          if ((src1->m_width <= uVar9) || (src1->m_height <= uVar8)) {
LAB_0025639c:
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3d,"const vec4F &basisu::imagef::operator()(uint32_t, uint32_t) const"
                         );
          }
          uVar10 = src1->m_pitch * uVar8 + uVar9;
          if ((src1->m_pixels).m_size <= uVar10) {
LAB_002563bb:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) const [T = basisu::vec<4, float>]"
                         );
          }
          if ((src2->m_width <= uVar9) || (src2->m_height <= uVar8)) goto LAB_0025639c;
          uVar12 = src2->m_pitch * uVar8 + uVar9;
          if ((src2->m_pixels).m_size <= uVar12) goto LAB_002563bb;
          if (dst->m_height <= uVar8) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3e,"vec4F &basisu::imagef::operator()(uint32_t, uint32_t)");
          }
          uVar14 = dst->m_pitch * uVar8 + uVar9;
          if ((dst->m_pixels).m_size <= uVar14) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) [T = basisu::vec<4, float>]"
                         );
          }
          pvVar11 = (src1->m_pixels).m_p + uVar10;
          pvVar13 = (src2->m_pixels).m_p + uVar12;
          fVar2 = pvVar11->m_v[1];
          fVar3 = pvVar11->m_v[2];
          fVar4 = pvVar11->m_v[3];
          fVar5 = pvVar13->m_v[1];
          fVar6 = pvVar13->m_v[2];
          fVar7 = pvVar13->m_v[3];
          pvVar1 = (dst->m_pixels).m_p + uVar14;
          pvVar1->m_v[0] = pvVar13->m_v[0] + pvVar11->m_v[0];
          pvVar1->m_v[1] = fVar5 + fVar2;
          pvVar1->m_v[2] = fVar6 + fVar3;
          pvVar1->m_v[3] = fVar7 + fVar4;
          uVar9 = uVar9 + 1;
        } while (uVar9 < dst->m_width);
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (int)dst->m_height);
  }
  return;
}

Assistant:

void add_image(const imagef &src1, const imagef &src2, imagef &dst)
	{
		dst.resize(src1);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &s1 = src1(x, y);
				const vec4F &s2 = src2(x, y);

				dst(x, y).set(s1[0] + s2[0], s1[1] + s2[1], s1[2] + s2[2], s1[3] + s2[3]);
			}
		}
	}